

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O1

void __thiscall
icu_63::StringCharacterIterator::StringCharacterIterator
          (StringCharacterIterator *this,StringCharacterIterator *that)

{
  ushort uVar1;
  char16_t *pcVar2;
  
  UCharCharacterIterator::UCharCharacterIterator
            (&this->super_UCharCharacterIterator,&that->super_UCharCharacterIterator);
  (this->super_UCharCharacterIterator).super_CharacterIterator.super_ForwardCharacterIterator.
  super_UObject._vptr_UObject = (_func_int **)&PTR__StringCharacterIterator_0024d3e0;
  UnicodeString::UnicodeString(&this->text,&that->text);
  uVar1 = (this->text).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar2 = (this->text).fUnion.fFields.fArray;
    }
    else {
      pcVar2 = (char16_t *)((long)&(this->text).fUnion + 2);
    }
  }
  else {
    pcVar2 = (char16_t *)0x0;
  }
  (this->super_UCharCharacterIterator).text = pcVar2;
  return;
}

Assistant:

StringCharacterIterator::StringCharacterIterator(const StringCharacterIterator& that)
  : UCharCharacterIterator(that),
    text(that.text)
{
    // we had set the input parameter's array, now we need to set our copy's array
    UCharCharacterIterator::text = this->text.getBuffer();
}